

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

void __thiscall S2Polygon::Shape::Init(Shape *this,S2Polygon *polygon)

{
  pointer puVar1;
  bool bVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  this->polygon_ = polygon;
  if (this->cumulative_edges_ != (int *)0x0) {
    operator_delete__(this->cumulative_edges_);
  }
  this->cumulative_edges_ = (int *)0x0;
  *(undefined4 *)&(this->super_S2Shape).field_0xc = 0;
  bVar2 = is_full(polygon);
  if (!bVar2) {
    puVar1 = (polygon->loops_).
             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(polygon->loops_).
                  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    uVar7 = uVar3 >> 3;
    iVar6 = (int)uVar7;
    if (iVar6 < 0xd) {
      piVar4 = this->cumulative_edges_;
    }
    else {
      piVar4 = (int *)operator_new__(uVar3 >> 1 & 0x1fffffffc);
      this->cumulative_edges_ = piVar4;
    }
    uVar5 = 0;
    uVar3 = uVar7 & 0xffffffff;
    if (iVar6 < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      iVar6 = *(int *)&(this->super_S2Shape).field_0xc;
      if (piVar4 != (int *)0x0) {
        piVar4[uVar5] = iVar6;
      }
      *(int *)&(this->super_S2Shape).field_0xc =
           iVar6 + *(int *)((long)puVar1[uVar5]._M_t.
                                  super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t +
                           0xc);
    }
  }
  return;
}

Assistant:

void S2Polygon::Shape::Init(const S2Polygon* polygon) {
  polygon_ = polygon;
  delete[] cumulative_edges_;
  cumulative_edges_ = nullptr;
  num_edges_ = 0;
  if (!polygon->is_full()) {
    const int kMaxLinearSearchLoops = 12;  // From benchmarks.
    int num_loops = polygon->num_loops();
    if (num_loops > kMaxLinearSearchLoops) {
      cumulative_edges_ = new int[num_loops];
    }
    for (int i = 0; i < num_loops; ++i) {
      if (cumulative_edges_) cumulative_edges_[i] = num_edges_;
      num_edges_ += polygon->loop(i)->num_vertices();
    }
  }
}